

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-history.c
# Opt level: O3

void history_display(void)

{
  ulong uVar1;
  bool bVar2;
  _Bool _Var3;
  keycode_t kVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  keypress kVar13;
  wchar_t hgt;
  history_info *history_list_local;
  wchar_t wid;
  char buf [120];
  int local_c4;
  history_info *local_c0;
  long local_b8;
  int local_ac;
  char local_a8 [120];
  
  local_c0 = (history_info *)0x0;
  sVar6 = history_get_list(player,&local_c0);
  Term_get_size(&local_ac,&local_c4);
  local_b8 = (long)local_c4;
  lVar12 = local_b8 + -5;
  screen_save();
  sVar7 = history_display::first_item;
switchD_001d0780_caseD_6c:
  history_display::first_item = sVar7;
  bVar2 = 4 < (int)local_b8;
  Term_clear();
  c_put_str('\x01',"[Player history]",L'\0',L'\0');
  c_put_str('\x0e',"      Turn   Depth  Note",L'\x01',L'\0');
  iVar11 = (int)lVar12;
  if (history_display::first_item < sVar6 && bVar2) {
    lVar8 = history_display::first_item * 0x5c;
    lVar9 = history_display::first_item + 1;
    lVar10 = 0;
    do {
      strnfmt(local_a8,0x78,"%10ld%7d\'  %s",(long)*(int *)(local_c0->event + lVar8 + -4),
              (ulong)(uint)(*(short *)(local_c0->type + lVar8 + 2) * 0x32));
      _Var3 = flag_has_dbg(local_c0->type + lVar8,2,4,"history_list_local[i].type",
                           "HIST_ARTIFACT_LOST");
      if (_Var3) {
        my_strcat(local_a8," (LOST)",0x78);
      }
      prt(local_a8,(int)lVar10 + L'\x02',L'\0');
      if (iVar11 <= (int)lVar10) break;
      uVar1 = lVar9 + lVar10;
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x5c;
    } while (uVar1 < sVar6);
  }
  prt("[Arrow keys scroll, p/PgUp for previous page, n/PgDn for next page, ESC to exit.]",
      local_c4 + L'\xffffffff',L'\0');
  kVar13 = inkey();
  kVar4 = kVar13.code;
  sVar7 = history_display::first_item;
  if (0x7f < (int)kVar4) {
    if ((int)kVar4 < 0x95) {
      if (kVar4 == 0x80) goto switchD_001d0780_caseD_6a;
      if (kVar4 == 0x83) {
switchD_001d0780_caseD_6b:
        uVar5 = (int)history_display::first_item - 1;
LAB_001d07d5:
        sVar7 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          sVar7 = 0;
        }
      }
    }
    else {
      if (kVar4 == 0x95) goto switchD_001d0780_caseD_70;
      if (kVar4 == 0x97) goto switchD_001d0780_caseD_6e;
      if (kVar4 == 0xe000) {
        screen_load();
        return;
      }
    }
    goto switchD_001d0780_caseD_6c;
  }
  switch(kVar4) {
  case 0x6a:
switchD_001d0780_caseD_6a:
    sVar7 = history_display::first_item + 1;
    goto LAB_001d07f4;
  case 0x6b:
    goto switchD_001d0780_caseD_6b;
  case 0x6c:
  case 0x6d:
  case 0x6f:
    goto switchD_001d0780_caseD_6c;
  case 0x6e:
    goto switchD_001d0780_caseD_6e;
  case 0x70:
switchD_001d0780_caseD_70:
    uVar5 = (int)history_display::first_item - iVar11;
    goto LAB_001d07d5;
  default:
    if (kVar4 != 0x20) goto switchD_001d0780_caseD_6c;
switchD_001d0780_caseD_6e:
    sVar7 = history_display::first_item + lVar12;
LAB_001d07f4:
    if (sVar6 <= sVar7) {
      sVar7 = sVar6;
    }
    goto switchD_001d0780_caseD_6c;
  }
}

Assistant:

void history_display(void)
{
	struct history_info *history_list_local = NULL;
	size_t max_item = history_get_list(player, &history_list_local);
	int row, wid, hgt, page_size;
	char buf[120];
	static size_t first_item = 0;
	size_t i;
	bool active = true;

	Term_get_size(&wid, &hgt);

	/* Five lines provide space for the header and footer */
	page_size = hgt - 5;

	screen_save();

	while (active)
	{
		struct keypress ch;

		Term_clear();

		/* Print everything to screen */
		print_history_header();

		row = 0;
		for (i = first_item; row <= page_size && i < max_item; i++)
		{
			strnfmt(buf, sizeof(buf), "%10ld%7d\'  %s",
				(long)history_list_local[i].turn,
				history_list_local[i].dlev * 50,
				history_list_local[i].event);

			if (hist_has(history_list_local[i].type, HIST_ARTIFACT_LOST))
				my_strcat(buf, " (LOST)", sizeof(buf));

			/* Size of header = 3 lines */
			prt(buf, row + 2, 0);
			row++;
		}
		prt("[Arrow keys scroll, p/PgUp for previous page, n/PgDn for next page, ESC to exit.]", hgt - 1, 0);

		ch = inkey();

		switch (ch.code) {
			case 'n':
			case ' ':
			case KC_PGDOWN: {
				size_t scroll_to = first_item + page_size;
				first_item = (scroll_to < max_item ? scroll_to : max_item);
				break;
			}

			case 'p':
			case KC_PGUP: {
				int scroll_to = first_item - page_size;
				first_item = (scroll_to >= 0 ? scroll_to : 0);
				break;
			}

			case 'j':
			case ARROW_DOWN: {
				size_t scroll_to = first_item + 1;
				first_item = (scroll_to < max_item ? scroll_to : max_item);
				break;
			}

			case 'k':
			case ARROW_UP: {
				int scroll_to = first_item - 1;
				first_item = (scroll_to >= 0 ? scroll_to : 0);
				break;
			}

			case ESCAPE:
				active = false;
				break;
		}
	}

	screen_load();

	return;
}